

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.hpp
# Opt level: O2

void __thiscall
duckdb::Relation::Relation
          (Relation *this,shared_ptr<duckdb::RelationContextWrapper,_true> *context,
          RelationType type,string *alias_p)

{
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<duckdb::Relation>).__weak_this_.internal.
  super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->_vptr_Relation = (_func_int **)&PTR__Relation_0279a1a0;
  ::std::__shared_ptr<duckdb::ClientContextWrapper,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<duckdb::RelationContextWrapper,void>
            ((__shared_ptr<duckdb::ClientContextWrapper,(__gnu_cxx::_Lock_policy)2> *)&this->context
             ,(__shared_ptr<duckdb::RelationContextWrapper,_(__gnu_cxx::_Lock_policy)2> *)context);
  this->type = type;
  CreateRelationAlias(&this->alias,type,alias_p);
  (this->external_dependencies).
  super_vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->external_dependencies).
  super_vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->external_dependencies).
  super_vector<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>
  .
  super__Vector_base<duckdb::shared_ptr<duckdb::ExternalDependency,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ExternalDependency,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Relation(const shared_ptr<RelationContextWrapper> &context, RelationType type, const string &alias_p = "")
	    : context(context), type(type), alias(CreateRelationAlias(type, alias_p)) {
	}